

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35d0fd::SwiftGetVersionCommand::getShortDescription
          (SwiftGetVersionCommand *this,SmallVectorImpl<char> *result)

{
  StringRef Str;
  raw_ostream local_38;
  SmallVectorImpl<char> *local_10;
  
  local_38.BufferMode = InternalBuffer;
  local_38.OutBufStart = (char *)0x0;
  local_38.OutBufEnd = (char *)0x0;
  local_38.OutBufCur = (char *)0x0;
  local_38._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_0023fdc8;
  local_10 = result;
  llvm::raw_ostream::SetUnbuffered(&local_38);
  Str.Length = 0x1f;
  Str.Data = "Checking Swift Compiler Version";
  llvm::raw_ostream::operator<<(&local_38,Str);
  llvm::raw_ostream::~raw_ostream(&local_38);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << "Checking Swift Compiler Version";
  }